

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O2

int HU_GetRowColor(player_t *player,bool highlight)

{
  bool bVar1;
  uint uiTeam;
  int iVar2;
  FIntCVar *pFVar3;
  FIntCVar *pFVar4;
  
  if (deathmatch.Value == 0 || !teamplay.Value) {
    if (highlight) {
      pFVar3 = &sb_cooperative_yourplayercolor;
      pFVar4 = &sb_deathmatch_yourplayercolor;
    }
    else {
      if ((demoplayback) && ((player_t *)(&players + (long)consoleplayer * 0x54) == player)) {
        return 5;
      }
      pFVar3 = &sb_cooperative_otherplayercolor;
      pFVar4 = &sb_deathmatch_otherplayercolor;
    }
    if (deathmatch.Value == 0) {
      pFVar4 = pFVar3;
    }
    iVar2 = pFVar4->Value;
  }
  else {
    uiTeam = userinfo_t::GetTeam(&player->userinfo);
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,uiTeam);
    if (bVar1) {
      iVar2 = userinfo_t::GetTeam(&player->userinfo);
      iVar2 = FTeam::GetTextColor(Teams.Array + iVar2);
      return iVar2;
    }
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int HU_GetRowColor(player_t *player, bool highlight)
{
	if (teamplay && deathmatch)
	{
		if (TeamLibrary.IsValidTeam (player->userinfo.GetTeam()))
			return Teams[player->userinfo.GetTeam()].GetTextColor();
		else
			return CR_GREY;
	}
	else
	{
		if (!highlight)
		{
			if (demoplayback && player == &players[consoleplayer])
			{
				return CR_GOLD;
			}
			else
			{
				return deathmatch ? sb_deathmatch_otherplayercolor : sb_cooperative_otherplayercolor;
			}
		}
		else
		{
			return deathmatch ? sb_deathmatch_yourplayercolor : sb_cooperative_yourplayercolor;
		}
	}
}